

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O2

void __thiscall max_flow_algo::gap_heuristic(max_flow_algo *this,NodeID level)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  NodeID node;
  ulong uVar5;
  
  this->m_gaps = this->m_gaps + 1;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(this->adj->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->adj->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar5 = uVar5 + 1)
  {
    if ((this->active->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar5] < 0) {
      piVar2 = (this->m_distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (level <= piVar2[uVar5]) {
        piVar3 = (this->m_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar1 = piVar3 + piVar2[uVar5];
        *piVar1 = *piVar1 + -1;
        iVar4 = this->rn;
        if (this->rn < piVar2[uVar5]) {
          iVar4 = piVar2[uVar5];
        }
        piVar2[uVar5] = iVar4;
        piVar1 = piVar3 + iVar4;
        *piVar1 = *piVar1 + 1;
        enqueue(this,(NodeID)uVar5);
      }
    }
  }
  return;
}

Assistant:

void gap_heuristic(NodeID level)
    {
        m_gaps++;
        for (NodeID node = 0; node < adj.size(); node++)
        {
            if (isActive(node))
            {
                if (m_distance[node] < level)
                    continue;
                m_count[m_distance[node]]--;
                m_distance[node] = std::max(m_distance[node], rn);
                m_count[m_distance[node]]++;
                enqueue(node);
            }
        }
    }